

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

PrgBody * Clasp::Asp::PrgBody::create(LogicProgram *prg,uint32 id,Rule *r,uint32 pos,bool addDeps)

{
  weight_t wVar1;
  PrgBody *this;
  uint uVar2;
  long lVar3;
  
  lVar3 = (r->field_3).cond.size * 4;
  if ((r->bt).val_ != Normal) {
    this = (PrgBody *)operator_new(lVar3 + 0x20);
    PrgBody(this,id,prg,&(r->field_3).agg,(r->bt).val_ == Sum,pos,addDeps);
    wVar1 = bound(this);
    if (0 < wVar1) {
      if ((*(uint *)&this->field_0x8 & 0x18000000) == 0x8000000) {
        uVar2 = *(uint *)((long)this[1].super_PrgNode + 4);
      }
      else {
        uVar2 = *(uint *)&this->field_0x8 & 0x1ffffff;
      }
      wVar1 = bound(this);
      if (wVar1 < (int)uVar2) goto LAB_00147164;
    }
    Potassco::fail(-2,
                   "static PrgBody *Clasp::Asp::PrgBody::create(LogicProgram &, uint32, const Rule &, uint32, bool)"
                   ,0x2cf,"ret->bound() > 0 && ret->sumW() > ret->bound()","body not simplified",0);
  }
  this = (PrgBody *)operator_new(lVar3 + 0x18);
  PrgBody(this,id,prg,&(r->field_3).cond,pos,addDeps);
LAB_00147164:
  wVar1 = bound(this);
  if (wVar1 == 0) {
    assignValue(this,'\x01');
    this->field_0xb = this->field_0xb | 0x20;
  }
  return this;
}

Assistant:

PrgBody* PrgBody::create(LogicProgram& prg, uint32 id, const Rule& r, uint32 pos, bool addDeps) {
	static_assert(sizeof(PrgBody) == 24 && sizeof(Agg) == sizeof(void*), "unexpected alignment");
	PrgBody* ret = 0;
	if (r.normal()) {
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.cond) * sizeof(Literal));
		ret = new (::operator new(bytes)) PrgBody(id, prg, r.cond, pos, addDeps);
	}
	else {
		const Potassco::Sum_t& sum = r.agg;
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.agg.lits) * sizeof(Literal)) + sizeof(Agg);
		ret = new (::operator new(bytes)) PrgBody(id, prg, sum, r.bt == Body_t::Sum, pos, addDeps);
		POTASSCO_REQUIRE(ret->bound() > 0 && ret->sumW() > ret->bound(), "body not simplified");
	}
	if (ret->bound() == 0) {
		ret->assignValue(value_true);
		ret->markDirty();
	}
	return ret;
}